

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::Cord::InlineRep::PrependTreeToTree
          (InlineRep *this,Nonnull<CordRep_*> tree,MethodIdentifier method)

{
  CordzInfo *info;
  CordRep *rep;
  Nonnull<CordRepBtree_*> tree_00;
  CordRepBtree *rep_00;
  CordzUpdateScope scope;
  CordzUpdateScope local_20;
  
  if (((this->data_).rep_.field_0.data[0] & 1U) != 0) {
    info = cord_internal::InlineData::cordz_info(&this->data_);
    cord_internal::CordzUpdateScope::CordzUpdateScope(&local_20,info,method);
    rep = cord_internal::InlineData::as_tree(&this->data_);
    tree_00 = ForceBtree(rep);
    rep_00 = cord_internal::CordRepBtree::Prepend(tree_00,tree);
    SetTree(this,&rep_00->super_CordRep,&local_20);
    cord_internal::CordzUpdateScope::~CordzUpdateScope(&local_20);
    return;
  }
  __assert_fail("is_tree()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                ,0xf8,
                "void absl::Cord::InlineRep::PrependTreeToTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
               );
}

Assistant:

void Cord::InlineRep::PrependTreeToTree(absl::Nonnull<CordRep*> tree,
                                        MethodIdentifier method) {
  assert(is_tree());
  const CordzUpdateScope scope(data_.cordz_info(), method);
  tree = CordRepBtree::Prepend(ForceBtree(data_.as_tree()), tree);
  SetTree(tree, scope);
}